

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall SubcommandProgram_CaseCheck_Test::TestBody(SubcommandProgram_CaseCheck_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  App *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  allocator local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c2;
  allocator local_c1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  iterator local_98;
  size_type local_90;
  AssertHelper local_88;
  Message local_80 [2];
  ExtrasError *anon_var_0;
  char *pcStack_68;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  SubcommandProgram_CaseCheck_Test *this_local;
  
  gtest_msg.value._3_1_ = 1;
  local_48 = &local_40;
  local_10 = (undefined1  [8])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Start",&local_49);
  gtest_msg.value._3_1_ = 0;
  local_20 = &local_40;
  local_18 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_20;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_01);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_128 = local_128 + -1;
    std::__cxx11::string::~string((string *)local_128);
  } while (local_128 != &local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff98,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff98);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run((TApp *)this);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_00126862;
    pcStack_68 = 
    "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_80);
  testing::internal::AssertHelper::AssertHelper
            (&local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x1ea,pcStack_68);
  testing::internal::AssertHelper::operator=(&local_88,local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  testing::Message::~Message(local_80);
LAB_00126862:
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  local_c2 = '\x01';
  local_c1._1_8_ = &local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"start",local_c1);
  local_c2 = '\0';
  local_98 = &local_b8;
  local_90 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_98;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_00);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98;
  do {
    local_180 = local_180 + -1;
    std::__cxx11::string::~string((string *)local_180);
  } while (local_180 != &local_b8);
  std::allocator<char>::~allocator((allocator<char> *)local_c1);
  TApp::run((TApp *)this);
  this_00 = &(this->super_SubcommandProgram).super_TApp.app;
  CLI::App::reset(this_00);
  CLI::App::ignore_case((this->super_SubcommandProgram).start,true);
  TApp::run((TApp *)this);
  CLI::App::reset(this_00);
  local_100 = &local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"Start",&local_101);
  local_d8 = &local_f8;
  local_d0 = 1;
  __l._M_len = 1;
  __l._M_array = local_d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l);
  local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8;
  do {
    local_1b0 = local_1b0 + -1;
    std::__cxx11::string::~string((string *)local_1b0);
  } while (local_1b0 != &local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  TApp::run((TApp *)this);
  return;
}

Assistant:

TEST_F(SubcommandProgram, CaseCheck) {
    args = {"Start"};
    EXPECT_THROW(run(), CLI::ExtrasError);

    app.reset();
    args = {"start"};
    run();

    app.reset();
    start->ignore_case();
    run();

    app.reset();
    args = {"Start"};
    run();
}